

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

int rludecomp(double *A,int M,int N,int *ipiv)

{
  int iVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  ulong local_50;
  double *local_48;
  
  if (0 < M) {
    uVar5 = 0;
    do {
      ipiv[uVar5] = (int)uVar5;
      uVar5 = uVar5 + 1;
    } while ((uint)M != uVar5);
  }
  if (N < M) {
    if (0 < N) {
      uVar2 = (ulong)(uint)N;
      local_48 = A + uVar2;
      local_50 = 1;
      uVar5 = 0;
      pdVar14 = A;
      uVar15 = uVar2;
      pdVar12 = A;
      do {
        uVar9 = (uint)uVar5;
        uVar7 = uVar9 * N;
        uVar8 = uVar5 + 1;
        if ((long)uVar8 < (long)M) {
          dVar19 = ABS(A[uVar5 + uVar7]);
          uVar10 = uVar5 & 0xffffffff;
          uVar6 = local_50;
          pdVar3 = local_48;
          do {
            dVar20 = ABS(*pdVar3);
            if (dVar19 < dVar20) {
              uVar10 = uVar6 & 0xffffffff;
            }
            uVar9 = (uint)uVar10;
            uVar17 = -(ulong)(dVar19 < dVar20);
            dVar19 = (double)(~uVar17 & (ulong)dVar19 | (ulong)*pdVar3 & uVar17);
            uVar6 = uVar6 + 1;
            pdVar3 = pdVar3 + uVar2;
          } while ((uint)M != uVar6);
        }
        if (uVar5 != uVar9) {
          iVar16 = ipiv[(int)uVar9];
          ipiv[(int)uVar9] = ipiv[uVar5];
          ipiv[uVar5] = iVar16;
          uVar6 = 0;
          do {
            dVar19 = pdVar14[uVar6];
            pdVar14[uVar6] = A[(long)(int)(uVar9 * N) + uVar6];
            A[(long)(int)(uVar9 * N) + uVar6] = dVar19;
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        dVar19 = A[uVar5 + uVar7];
        pdVar3 = local_48;
        uVar6 = local_50;
        if ((long)uVar8 < (long)M && dVar19 != 0.0) {
          do {
            dVar20 = A[uVar5 + uVar6 * uVar2] / dVar19;
            A[uVar5 + uVar6 * uVar2] = dVar20;
            if (uVar8 < uVar2) {
              uVar10 = 1;
              do {
                pdVar3[uVar10] = pdVar12[uVar10] * -dVar20 + pdVar3[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar15 != uVar10);
            }
            uVar6 = uVar6 + 1;
            pdVar3 = pdVar3 + uVar2;
          } while (uVar6 != (uint)M);
        }
        local_50 = local_50 + 1;
        local_48 = local_48 + uVar2 + 1;
        pdVar14 = pdVar14 + uVar2;
        pdVar12 = pdVar12 + uVar2 + 1;
        uVar15 = uVar15 - 1;
        uVar5 = uVar8;
      } while (uVar8 != uVar2);
    }
  }
  else if (M < N) {
    if (1 < M) {
      lVar11 = (long)N;
      pdVar14 = A + lVar11;
      uVar8 = 1;
      uVar2 = 0;
      uVar5 = 0;
      pdVar12 = A;
      uVar15 = (ulong)(uint)N;
      pdVar3 = A;
      do {
        lVar13 = (long)((int)uVar5 * N);
        uVar6 = uVar5 + 1;
        dVar19 = ABS(A[uVar5 + lVar13]);
        uVar17 = uVar5 & 0xffffffff;
        pdVar4 = pdVar14;
        uVar10 = uVar8;
        do {
          dVar20 = ABS(*pdVar4);
          if (dVar19 < dVar20) {
            uVar17 = uVar10 & 0xffffffff;
          }
          uVar18 = -(ulong)(dVar19 < dVar20);
          dVar19 = (double)(~uVar18 & (ulong)dVar19 | (ulong)*pdVar4 & uVar18);
          uVar10 = uVar10 + 1;
          pdVar4 = pdVar4 + lVar11;
        } while ((uint)M != uVar10);
        iVar16 = (int)uVar17;
        if (uVar5 != uVar17) {
          iVar1 = ipiv[iVar16];
          ipiv[iVar16] = ipiv[uVar5];
          ipiv[uVar5] = iVar1;
          if (0 < N) {
            uVar10 = 0;
            do {
              dVar19 = A[uVar2 + uVar10];
              pdVar12[uVar10] = A[(long)(iVar16 * N) + uVar10];
              A[(long)(iVar16 * N) + uVar10] = dVar19;
              uVar10 = uVar10 + 1;
            } while ((uint)N != uVar10);
          }
        }
        dVar19 = A[uVar5 + lVar13];
        pdVar4 = pdVar14;
        uVar10 = uVar8;
        if ((dVar19 != 0.0) || (NAN(dVar19))) {
          do {
            dVar20 = A[uVar5 + uVar10 * lVar11];
            A[uVar5 + uVar10 * lVar11] = dVar20 / dVar19;
            if ((long)uVar6 < lVar11) {
              uVar17 = 1;
              do {
                pdVar4[uVar17] = pdVar3[uVar17] * -(dVar20 / dVar19) + pdVar4[uVar17];
                uVar17 = uVar17 + 1;
              } while (uVar15 != uVar17);
            }
            uVar10 = uVar10 + 1;
            pdVar4 = pdVar4 + lVar11;
          } while (uVar10 != (uint)M);
        }
        uVar8 = uVar8 + 1;
        pdVar14 = pdVar14 + lVar11 + 1;
        uVar2 = (ulong)(uint)((int)uVar2 + N);
        pdVar12 = pdVar12 + lVar11;
        pdVar3 = pdVar3 + lVar11 + 1;
        uVar15 = uVar15 - 1;
        uVar5 = uVar6;
      } while (uVar6 != M - 1);
    }
  }
  else if (M == N) {
    pludecomp(A,N,ipiv);
  }
  return 0;
}

Assistant:

int rludecomp(double *A, int M, int N, int *ipiv) {
	int k, j, l, c1, c2, mind, tempi;
	double ld, mult, mval, temp;


	for (k = 0; k < M; ++k)
		ipiv[k] = (double) k;

	if (M > N) {
		for (k = 0; k < N; ++k) {
			mval = fabs(A[k*N + k]);
			mind = k;
			for (j = k + 1; j < M; ++j) {
				if (mval < fabs(A[j*N + k])) {
					mval = A[j*N + k];
					mind = j;
				}
			}

			if (mind != k) {
				c1 = k *N;
				c2 = mind * N;
				tempi = ipiv[mind];
				ipiv[mind] = ipiv[k];
				ipiv[k] = tempi;
				for (j = 0; j < N; j++) {
					temp = A[c1 + j];
					*(A + c1 + j) = *(A + c2 + j);
					*(A + c2 + j) = temp;
				}
			}

			c2 = k*N;
			ld = A[c2 + k];
			if (ld != 0. && k < N) {
				for (j = k + 1; j < M; ++j) {
					c1 = j*N;
					mult = A[c1 + k] /= ld;
					//printf("\n k %d j %d mult %f \n",k,j,mult);
					for (l = k + 1; l < N; ++l) {
						A[c1 + l] -= mult * A[c2 + l];
					}
				}
			}
		}
	}
	else if (M < N) {
		for (k = 0; k < M-1; ++k) {
			mval = fabs(A[k*N + k]);
			mind = k;
			for (j = k + 1; j < M; ++j) {
				if (mval < fabs(A[j*N + k])) {
					mval = A[j*N + k];
					mind = j;
				}
			}

			if (mind != k) {
				c1 = k *N;
				c2 = mind * N;
				tempi = ipiv[mind];
				ipiv[mind] = ipiv[k];
				ipiv[k] = tempi;
				for (j = 0; j < N; j++) {
					temp = A[c1 + j];
					*(A + c1 + j) = *(A + c2 + j);
					*(A + c2 + j) = temp;
				}
			}

			c2 = k*N;
			ld = A[c2 + k];
			if (ld != 0.) {
				for (j = k + 1; j < M; ++j) {
					c1 = j*N;
					mult = A[c1 + k] /= ld;
					//printf("\n k %d j %d mult %f \n",k,j,mult);
					for (l = k + 1; l < N; ++l) {
						A[c1 + l] -= mult * A[c2 + l];
					}
				}
			}
		}
	}
	else if (M == N) {
		pludecomp(A,N,ipiv);
	}

	//mdisplay(ipiv, 1, M);

	return 0;

	
}